

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O1

int UpnpCloseHttpPost(void *handle,int *httpStatus,int timeout)

{
  int iVar1;
  
  iVar1 = http_EndHttpRequest(handle,timeout);
  if (iVar1 == 0) {
    http_GetHttpResponse(handle,(UpnpString *)0x0,(char **)0x0,(int *)0x0,httpStatus,timeout);
  }
  iVar1 = http_CloseHttpConnection(handle);
  return iVar1;
}

Assistant:

int UpnpCloseHttpPost(void *handle, int *httpStatus, int timeout)
{
	int status = http_EndHttpRequest(handle, timeout);
	if (status == UPNP_E_SUCCESS) {
		/*status = */ http_GetHttpResponse(
			handle, NULL, NULL, NULL, httpStatus, timeout);
	}
	status = http_CloseHttpConnection(handle);
	return status;
}